

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O1

void StoreSymbol(BlockEncoder *self,size_t symbol,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar8;
  long lVar9;
  long lVar7;
  
  if (self->block_len_ == 0) {
    sVar5 = self->block_ix_;
    self->block_ix_ = sVar5 + 1;
    uVar4 = self->block_lengths_[sVar5 + 1];
    uVar6 = (ulong)self->block_types_[sVar5 + 1];
    self->block_len_ = (ulong)uVar4;
    self->entropy_ix_ = self->histogram_length_ * uVar6;
    sVar5 = (self->block_split_code_).type_code_calculator.last_type;
    lVar9 = 1;
    if (sVar5 + 1 != uVar6) {
      lVar9 = 0;
      if ((self->block_split_code_).type_code_calculator.second_last_type != uVar6) {
        lVar9 = uVar6 + 2;
      }
    }
    (self->block_split_code_).type_code_calculator.second_last_type = sVar5;
    (self->block_split_code_).type_code_calculator.last_type = uVar6;
    uVar6 = *storage_ix;
    uVar8 = (self->block_split_code_).type_depths[lVar9] + uVar6;
    *(ulong *)(storage + (uVar6 >> 3)) =
         (ulong)(self->block_split_code_).type_bits[lVar9] << ((byte)uVar6 & 7) |
         (ulong)storage[uVar6 >> 3];
    *storage_ix = uVar8;
    lVar9 = 0xe;
    if (0x2f0 < uVar4) {
      lVar9 = 0x14;
    }
    lVar7 = 7;
    if (uVar4 < 0x29) {
      lVar7 = 0;
    }
    if (0xb0 < uVar4) {
      lVar7 = lVar9;
    }
    uVar6 = lVar7 - 1;
    do {
      if (uVar6 == 0x18) {
        uVar6 = 0x19;
        break;
      }
      lVar9 = uVar6 * 4;
      uVar6 = uVar6 + 1;
    } while (*(ushort *)(duckdb_brotli::_kBrotliPrefixCodeRanges + lVar9 + 8) <= uVar4);
    uVar6 = uVar6 & 0xffffffff;
    bVar1 = duckdb_brotli::_kBrotliPrefixCodeRanges[uVar6 * 4 + 2];
    uVar3 = *(ushort *)(duckdb_brotli::_kBrotliPrefixCodeRanges + uVar6 * 4);
    bVar2 = (self->block_split_code_).length_depths[uVar6];
    *(ulong *)(storage + (uVar8 >> 3)) =
         (ulong)(self->block_split_code_).length_bits[uVar6] << ((byte)uVar8 & 7) |
         (ulong)storage[uVar8 >> 3];
    uVar8 = bVar2 + uVar8;
    *storage_ix = uVar8;
    *(ulong *)(storage + (uVar8 >> 3)) =
         (ulong)(uVar4 - uVar3) << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
    *storage_ix = uVar8 + bVar1;
  }
  self->block_len_ = self->block_len_ - 1;
  lVar9 = symbol + self->entropy_ix_;
  bVar1 = self->depths_[lVar9];
  uVar6 = *storage_ix;
  *(ulong *)(storage + (uVar6 >> 3)) =
       (ulong)self->bits_[lVar9] << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
  *storage_ix = bVar1 + uVar6;
  return;
}

Assistant:

static void StoreSymbol(BlockEncoder* self, size_t symbol, size_t* storage_ix,
    uint8_t* storage) {
  if (self->block_len_ == 0) {
    size_t block_ix = ++self->block_ix_;
    uint32_t block_len = self->block_lengths_[block_ix];
    uint8_t block_type = self->block_types_[block_ix];
    self->block_len_ = block_len;
    self->entropy_ix_ = block_type * self->histogram_length_;
    StoreBlockSwitch(&self->block_split_code_, block_len, block_type, 0,
        storage_ix, storage);
  }
  --self->block_len_;
  {
    size_t ix = self->entropy_ix_ + symbol;
    BrotliWriteBits(self->depths_[ix], self->bits_[ix], storage_ix, storage);
  }
}